

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O2

void sf::priv::InputImpl::setMousePosition(Vector2i *position,Window *relativeTo)

{
  Display *display;
  WindowHandle WVar1;
  
  display = OpenDisplay();
  WVar1 = Window::getSystemHandle(relativeTo);
  if (WVar1 != 0) {
    XWarpPointer(display,0,WVar1,0,0,0,0,position->x,position->y);
    XFlush(display);
  }
  CloseDisplay(display);
  return;
}

Assistant:

void InputImpl::setMousePosition(const Vector2i& position, const Window& relativeTo)
{
    // Open a connection with the X server
    Display* display = OpenDisplay();

    WindowHandle handle = relativeTo.getSystemHandle();
    if (handle)
    {
        XWarpPointer(display, None, handle, 0, 0, 0, 0, position.x, position.y);
        XFlush(display);
    }

    // Close the connection with the X server
    CloseDisplay(display);
}